

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O2

void charls::transform_line_to_quad<charls::transform_hp2<unsigned_short>::inverse,unsigned_short>
               (unsigned_short *source,size_t pixel_stride_in,quad<unsigned_short> *destination,
               size_t pixel_stride,inverse *transform)

{
  quad<unsigned_short> qVar1;
  size_t sVar2;
  
  if (pixel_stride_in < pixel_stride) {
    pixel_stride = pixel_stride_in;
  }
  for (sVar2 = 0; pixel_stride != sVar2; sVar2 = sVar2 + 1) {
    qVar1.super_triplet<unsigned_short> =
         transform_hp2<unsigned_short>::inverse::operator()
                   (transform,(uint)source[sVar2],(uint)source[pixel_stride_in + sVar2],
                    (uint)source[pixel_stride_in * 2 + sVar2]);
    qVar1.field_0.v4 =
         ((anon_union_2_2_7f9ecb5c_for_quad<unsigned_short>_2 *)
         (source + pixel_stride_in * 3 + sVar2))->v4;
    destination[sVar2] = qVar1;
  }
  return;
}

Assistant:

void transform_line_to_quad(const PixelType* source, const size_t pixel_stride_in, quad<PixelType>* destination,
                            const size_t pixel_stride, Transform& transform) noexcept
{
    const auto pixel_count{std::min(pixel_stride, pixel_stride_in)};

    for (size_t i{}; i < pixel_count; ++i)
    {
        const quad<PixelType> pixel(transform(source[i], source[i + pixel_stride_in], source[i + 2 * pixel_stride_in]),
                                    source[i + 3 * pixel_stride_in]);
        destination[i] = pixel;
    }
}